

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service_base::
async_send<asio::const_buffers_1,asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,asio::any_io_executor>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          const_buffers_1 *buffers,message_flags flags,
          write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
          *handler,any_io_executor *io_ex)

{
  bool bVar1;
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  *prVar2;
  long in_RSI;
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  *in_RDI;
  ptr p;
  type slot;
  bool is_continuation;
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
  *in_stack_ffffffffffffff48;
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
  *in_stack_ffffffffffffff50;
  const_buffers_1 *in_stack_ffffffffffffff58;
  state_type in_stack_ffffffffffffff63;
  undefined2 uVar3;
  socket_type in_stack_ffffffffffffff64;
  uint uVar4;
  reactor_op *in_stack_ffffffffffffff68;
  int op_type;
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  *impl_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  any_io_executor *in_stack_ffffffffffffff88;
  cancellation_slot local_40;
  undefined1 local_31;
  long local_10;
  
  local_10 = in_RSI;
  local_31 = asio_handler_cont_helpers::
             is_continuation<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>>
                       ((write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
                         *)0x41d610);
  local_40.handler_ =
       (cancellation_handler_base **)
       get_associated_cancellation_slot<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>>
                 (in_stack_ffffffffffffff48);
  prVar2 = reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
           ::ptr::allocate(in_stack_ffffffffffffff50);
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  ::reactive_socket_send_op
            (in_RDI,(error_code *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             in_stack_ffffffffffffff63,in_stack_ffffffffffffff58,
             (message_flags)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff88);
  uVar3 = (undefined2)in_stack_ffffffffffffff64;
  impl_00 = prVar2;
  bVar1 = cancellation_slot::is_connected(&local_40);
  if (bVar1) {
    in_stack_ffffffffffffff84 = 1;
    in_stack_ffffffffffffff68 =
         (reactor_op *)
         cancellation_slot::
         emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                   ((cancellation_slot *)
                    (in_RDI->super_reactive_socket_send_op_base<asio::const_buffers_1>).
                    super_reactor_op.super_operation.next_,(epoll_reactor **)(local_10 + 8),
                    (descriptor_state ***)CONCAT44(1,in_stack_ffffffffffffff80),(int *)impl_00,
                    (op_types *)in_RDI);
    (prVar2->super_reactive_socket_send_op_base<asio::const_buffers_1>).super_reactor_op.
    cancellation_key_ = in_stack_ffffffffffffff68;
  }
  op_type = (int)((ulong)in_RDI >> 0x20);
  uVar4 = (uint)CONCAT12(local_31,uVar3);
  if ((*(byte *)(local_10 + 4) & 0x10) != 0) {
    bVar1 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::all_empty
                      ((const_buffers_1 *)0x41d799);
    uVar4 = CONCAT13(bVar1,(int3)uVar4);
  }
  start_op((reactive_socket_service_base *)
           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           (base_implementation_type *)impl_00,op_type,in_stack_ffffffffffffff68,
           SUB41(uVar4 >> 0x18,0),SUB41(uVar4 >> 0x10,0),SUB41(uVar4 >> 8,0));
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  ::ptr::~ptr((ptr *)0x41d7f9);
  return;
}

Assistant:

void async_send(base_implementation_type& impl,
      const ConstBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    typename associated_cancellation_slot<Handler>::type slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_send_op<
        ConstBufferSequence, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_,
        impl.state_, buffers, flags, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::write_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_send"));

    start_op(impl, reactor::write_op, p.p, is_continuation, true,
        ((impl.state_ & socket_ops::stream_oriented)
          && buffer_sequence_adapter<asio::const_buffer,
            ConstBufferSequence>::all_empty(buffers)));
    p.v = p.p = 0;
  }